

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRRShared.cpp
# Opt level: O2

void __thiscall Assimp::IrrlichtBase::ReadVectorProperty(IrrlichtBase *this,VectorProperty *out)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  Logger *pLVar2;
  int i;
  uint uVar3;
  allocator<char> local_69;
  char *local_68 [4];
  float *local_48;
  float *local_40;
  aiVector3t<float> *local_38;
  
  local_38 = &out->value;
  local_40 = &(out->value).y;
  local_48 = &(out->value).z;
  uVar3 = 0;
  while( true ) {
    iVar1 = (*this->reader->_vptr_IIrrXMLReader[4])();
    if (iVar1 <= (int)uVar3) break;
    iVar1 = (*this->reader->_vptr_IIrrXMLReader[5])(this->reader,(ulong)uVar3);
    iVar1 = ASSIMP_stricmp((char *)CONCAT44(extraout_var,iVar1),"name");
    if (iVar1 == 0) {
      iVar1 = (*this->reader->_vptr_IIrrXMLReader[6])(this->reader,(ulong)uVar3);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_68,(char *)CONCAT44(extraout_var_02,iVar1),&local_69);
      std::__cxx11::string::operator=((string *)out,(string *)local_68);
      std::__cxx11::string::~string((string *)local_68);
    }
    else {
      iVar1 = (*this->reader->_vptr_IIrrXMLReader[5])(this->reader,(ulong)uVar3);
      iVar1 = ASSIMP_stricmp((char *)CONCAT44(extraout_var_00,iVar1),"value");
      if (iVar1 == 0) {
        iVar1 = (*this->reader->_vptr_IIrrXMLReader[6])(this->reader,(ulong)uVar3);
        local_68[0] = (char *)CONCAT44(extraout_var_01,iVar1);
        SkipSpaces<char>(local_68);
        local_68[0] = fast_atoreal_move<float>(local_68[0],&local_38->x,true);
        SkipSpaces<char>(local_68);
        if (*local_68[0] == ',') {
          SkipSpaces<char>(local_68[0] + 1,local_68);
        }
        else {
          pLVar2 = DefaultLogger::get();
          Logger::error(pLVar2,"IRR(MESH): Expected comma in vector definition");
        }
        local_68[0] = fast_atoreal_move<float>(local_68[0],local_40,true);
        SkipSpaces<char>(local_68);
        if (*local_68[0] == ',') {
          SkipSpaces<char>(local_68[0] + 1,local_68);
        }
        else {
          pLVar2 = DefaultLogger::get();
          Logger::error(pLVar2,"IRR(MESH): Expected comma in vector definition");
        }
        fast_atoreal_move<float>(local_68[0],local_48,true);
      }
    }
    uVar3 = uVar3 + 1;
  }
  return;
}

Assistant:

void IrrlichtBase::ReadVectorProperty  (VectorProperty&  out)
{
    for (int i = 0; i < reader->getAttributeCount();++i)
    {
        if (!ASSIMP_stricmp(reader->getAttributeName(i),"name"))
        {
            out.name = std::string( reader->getAttributeValue(i) );
        }
        else if (!ASSIMP_stricmp(reader->getAttributeName(i),"value"))
        {
            // three floats, separated with commas
            const char* ptr = reader->getAttributeValue(i);

            SkipSpaces(&ptr);
            ptr = fast_atoreal_move<float>( ptr,(float&)out.value.x );
            SkipSpaces(&ptr);
            if (',' != *ptr)
            {
                ASSIMP_LOG_ERROR("IRR(MESH): Expected comma in vector definition");
            }
            else SkipSpaces(ptr+1,&ptr);
            ptr = fast_atoreal_move<float>( ptr,(float&)out.value.y );
            SkipSpaces(&ptr);
            if (',' != *ptr)
            {
                ASSIMP_LOG_ERROR("IRR(MESH): Expected comma in vector definition");
            }
            else SkipSpaces(ptr+1,&ptr);
            ptr = fast_atoreal_move<float>( ptr,(float&)out.value.z );
        }
    }
}